

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VtabModuleUnref(sqlite3 *db,Module *pMod)

{
  int *piVar1;
  
  piVar1 = &pMod->nRefModule;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (pMod->xDestroy != (_func_void_void_ptr *)0x0) {
    (*pMod->xDestroy)(pMod->pAux);
  }
  sqlite3DbFreeNN(db,pMod);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabModuleUnref(sqlite3 *db, Module *pMod){
  assert( pMod->nRefModule>0 );
  pMod->nRefModule--;
  if( pMod->nRefModule==0 ){
    if( pMod->xDestroy ){
      pMod->xDestroy(pMod->pAux);
    }
    assert( pMod->pEpoTab==0 );
    sqlite3DbFree(db, pMod);
  }
}